

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O1

void Assimp::IFC::ProcessExtrudedArea
               (IfcExtrudedAreaSolid *solid,TempMesh *curve,IfcVector3 *extrusionDir,
               TempMesh *result,ConversionData *conv,bool collect_openings)

{
  pointer *ppaVar1;
  pointer *ppuVar2;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvVar3;
  __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
  __first;
  __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
  __last;
  pointer pTVar4;
  element_type *peVar5;
  double *pdVar6;
  iterator iVar7;
  iterator iVar8;
  IfcVector3 *pIVar9;
  _Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter> __comp;
  IfcVector3 __comp_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  IfcExtrudedAreaSolid *pIVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  IfcVector3 *v;
  IfcProfileDef *pIVar14;
  IfcAxis2Placement3D *in_00;
  pointer paVar15;
  IfcVector3 *pIVar16;
  ulong uVar17;
  IfcVector3 *pIVar18;
  aiVector3t<double> *paVar19;
  TempOpening *opening;
  ulong uVar20;
  pointer pTVar21;
  undefined7 in_register_00000089;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  TempMesh *pTVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  bool bVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> in;
  IfcVector3 dir;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> nors;
  shared_ptr<Assimp::IFC::TempMesh> profile2D;
  shared_ptr<Assimp::IFC::TempMesh> profile;
  TempMesh temp;
  IfcMatrix4 trafo;
  IfcVector3 profileNormal;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_240;
  ConversionData *local_228;
  double local_220;
  IfcVector3 local_218;
  TempOpening local_1f8;
  ulong local_198;
  TempMesh *local_190;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_188;
  undefined4 local_16c;
  TempMesh *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  TempMesh *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  TempMesh local_148;
  IfcExtrudedAreaSolid *local_118;
  undefined8 local_110;
  IfcMatrix4 local_108;
  double local_88;
  double dStack_80;
  double local_78;
  IfcExtrudedAreaSolid *local_68;
  double dStack_60;
  double local_58;
  IfcVector3 local_48;
  
  local_228 = conv;
  pIVar14 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProfileDef>
                      (*(LazyObject **)
                        &(solid->super_IfcSweptAreaSolid).super_IfcSolidModel.field_0x40);
  iVar12 = std::__cxx11::string::compare
                     (&(pIVar14->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                       field_0x10);
  if (iVar12 == 0) {
    lVar24 = (long)(curve->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(curve->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    local_110 = CONCAT71((int7)(lVar24 >> 0xb),2 < (ulong)((lVar24 >> 3) * -0x5555555555555555));
  }
  else {
    local_110 = 0;
  }
  if (1e-06 < solid->Depth || solid->Depth == 1e-06) {
    local_16c = (undefined4)CONCAT71(in_register_00000089,collect_openings);
    this_01 = &result->mVertcnt;
    local_190 = result;
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&result->mVerts,
               ((long)(curve->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(curve->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 <<
               (char)local_110 + 1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (this_01,((long)(curve->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(curve->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       + 2);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
              (&local_240,&curve->mVerts);
    local_108.a1 = 1.0;
    local_108.a2 = 0.0;
    local_108.a3 = 0.0;
    local_108.a4 = 0.0;
    local_108.b1 = 0.0;
    local_108.b2 = 1.0;
    local_108.b3 = 0.0;
    local_108.b4 = 0.0;
    local_108.c1 = 0.0;
    local_108.c2 = 0.0;
    local_108.c3 = 1.0;
    local_108.c4 = 0.0;
    local_108.d1 = 0.0;
    local_108.d2 = 0.0;
    local_108.d3 = 0.0;
    local_108.d4 = 1.0;
    local_118 = solid;
    in_00 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                      ((solid->super_IfcSweptAreaSolid).Position.obj);
    ConvertAxisPlacement(&local_108,in_00);
    if (local_240.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_240.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      dVar28 = -20000000000.0;
      dVar30 = -20000000000.0;
      dVar29 = -20000000000.0;
    }
    else {
      paVar15 = local_240.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start;
      dVar32 = -10000000000.0;
      dVar33 = -10000000000.0;
      dVar34 = 10000000000.0;
      dVar36 = 10000000000.0;
      dVar38 = 10000000000.0;
      dVar31 = -10000000000.0;
      do {
        dVar29 = ((IfcVector3 *)&paVar15->x)->x;
        dVar39 = paVar15->y;
        dVar37 = paVar15->z;
        dVar28 = local_108.a3 * dVar37 + local_108.a1 * dVar29 + local_108.a2 * dVar39 +
                 local_108.a4;
        dVar30 = local_108.b3 * dVar37 + local_108.b1 * dVar29 + local_108.b2 * dVar39 +
                 local_108.b4;
        dVar29 = dVar37 * local_108.c3 + dVar29 * local_108.c1 + dVar39 * local_108.c2 +
                 local_108.c4;
        ((IfcVector3 *)&paVar15->x)->x = dVar28;
        paVar15->y = dVar30;
        paVar15->z = dVar29;
        dVar39 = dVar28;
        if (dVar38 <= dVar28) {
          dVar39 = dVar38;
        }
        dVar37 = dVar30;
        if (dVar36 <= dVar30) {
          dVar37 = dVar36;
        }
        dVar35 = dVar29;
        if (dVar34 <= dVar29) {
          dVar35 = dVar34;
        }
        if (dVar28 <= dVar32) {
          dVar28 = dVar32;
        }
        if (dVar30 <= dVar33) {
          dVar30 = dVar33;
        }
        if (dVar29 <= dVar31) {
          dVar29 = dVar31;
        }
        paVar15 = paVar15 + 1;
        dVar32 = dVar28;
        dVar33 = dVar30;
        dVar34 = dVar35;
        dVar36 = dVar37;
        dVar38 = dVar39;
        dVar31 = dVar29;
      } while (paVar15 !=
               local_240.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish);
      dVar28 = dVar28 - dVar39;
      dVar30 = dVar30 - dVar37;
      dVar29 = dVar29 - dVar35;
    }
    local_220 = dVar29 * dVar29 + dVar28 * dVar28 + dVar30 * dVar30;
    if (local_220 < 0.0) {
      local_220 = sqrt(local_220);
    }
    else {
      local_220 = SQRT(local_220);
    }
    dVar29 = extrusionDir->x;
    dVar28 = extrusionDir->y;
    dVar30 = extrusionDir->z;
    local_218.x = local_108.a3 * dVar30 + local_108.a1 * dVar29 + local_108.a2 * dVar28;
    local_218.y = local_108.b3 * dVar30 + local_108.b1 * dVar29 + local_108.b2 * dVar28;
    local_218.z = dVar30 * local_108.c3 + dVar29 * local_108.c1 + dVar28 * local_108.c2;
    TempMesh::ComputePolygonNormal
              (&local_48,
               local_240.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start,
               ((long)local_240.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_240.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,true);
    if ((local_48.z * local_218.z + local_48.x * local_218.x + local_48.y * local_218.y < 0.0) &&
       (pIVar18 = local_240.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish + -1,
       pIVar9 = local_240.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start,
       local_240.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start < pIVar18 &&
       local_240.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start !=
       local_240.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)) {
      do {
        pIVar16 = pIVar9 + 1;
        local_1f8.extrusionDir.y = pIVar9->z;
        local_1f8.solid = (IfcSolidModel *)((IfcVector3 *)&pIVar9->x)->x;
        local_1f8.extrusionDir.x = pIVar9->y;
        pIVar9->z = pIVar18->z;
        dVar29 = pIVar18->y;
        ((IfcVector3 *)&pIVar9->x)->x = ((IfcVector3 *)&pIVar18->x)->x;
        pIVar9->y = dVar29;
        pIVar18->z = local_1f8.extrusionDir.y;
        ((IfcVector3 *)&pIVar18->x)->x = (double)local_1f8.solid;
        pIVar18->y = local_1f8.extrusionDir.x;
        pIVar18 = pIVar18 + -1;
        pIVar9 = pIVar16;
      } while (pIVar16 < pIVar18);
    }
    local_188.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (aiVector3t<double> *)0x0;
    local_188.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (aiVector3t<double> *)0x0;
    pvVar3 = local_228->apply_openings;
    if (pvVar3 == (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0
       ) {
      bVar27 = false;
    }
    else {
      bVar27 = (pvVar3->
               super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
               )._M_impl.super__Vector_impl_data._M_finish !=
               (pvVar3->
               super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    pTVar22 = local_190;
    if (bVar27) {
      if (local_228->settings->useCustomTriangulation == false) {
        __first._M_current =
             (pvVar3->
             super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
             )._M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             (pvVar3->
             super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_1f8.solid =
             (IfcSolidModel *)
             ((IfcVector3 *)
             &(local_240.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start)->x)->x;
        local_1f8.extrusionDir.x =
             (local_240.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->y;
        local_1f8.extrusionDir.y =
             (local_240.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->z;
        __comp_00.x = (local_240.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->x;
        __comp_00.y = (local_240.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->y;
        __comp_00.z = (local_240.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->z;
        local_68 = (IfcExtrudedAreaSolid *)local_1f8.solid;
        dStack_60 = local_1f8.extrusionDir.x;
        local_58 = local_1f8.extrusionDir.y;
        if (__first._M_current != __last._M_current) {
          uVar17 = ((long)__last._M_current - (long)__first._M_current >> 3) * 0x2e8ba2e8ba2e8ba3;
          lVar24 = 0x3f;
          if (uVar17 != 0) {
            for (; uVar17 >> lVar24 == 0; lVar24 = lVar24 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening*,std::vector<Assimp::IFC::TempOpening,std::allocator<Assimp::IFC::TempOpening>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter>>
                    (__first,__last,(ulong)(((uint)lVar24 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter>)__comp_00);
          __comp._M_comp.base.y = local_1f8.extrusionDir.x;
          __comp._M_comp.base.x = (double)local_1f8.solid;
          __comp._M_comp.base.z = local_1f8.extrusionDir.y;
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening*,std::vector<Assimp::IFC::TempOpening,std::allocator<Assimp::IFC::TempOpening>>>,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter>>
                    (__first,__last,__comp);
        }
      }
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                (&local_188,
                 ((long)(local_228->apply_openings->
                        super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_228->apply_openings->
                        super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3);
      this_01 = &local_148.mVertcnt;
      pTVar21 = (local_228->apply_openings->
                super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pTVar4 = (local_228->apply_openings->
               super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pTVar22 = &local_148;
      if (pTVar21 != pTVar4) {
        do {
          peVar5 = (pTVar21->profileMesh).
                   super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((ulong)(((long)(peVar5->mVerts).
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(peVar5->mVerts).
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
              < 3) {
            local_1f8.solid = (IfcSolidModel *)0x0;
            local_1f8.extrusionDir.x = 0.0;
            local_1f8.extrusionDir.y = 0.0;
            if (local_188.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_188.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_188
                         ,(iterator)
                          local_188.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                         (aiVector3t<double> *)&local_1f8);
            }
            else {
              (local_188.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = 0.0;
              (local_188.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->y = 0.0;
              (local_188.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->z = 0.0;
LAB_005b8455:
              local_188.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_188.
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            pdVar6 = &((peVar5->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->x;
            dVar30 = pdVar6[6] - *pdVar6;
            dVar32 = pdVar6[7] - pdVar6[1];
            dVar28 = pdVar6[8] - pdVar6[2];
            dVar33 = pdVar6[3] - *pdVar6;
            dVar29 = pdVar6[4] - pdVar6[1];
            dVar31 = pdVar6[5] - pdVar6[2];
            local_1f8.solid = (IfcSolidModel *)(dVar32 * dVar31 - dVar29 * dVar28);
            local_1f8.extrusionDir.x = dVar28 * dVar33 - dVar31 * dVar30;
            local_1f8.extrusionDir.y = dVar29 * dVar30 - dVar33 * dVar32;
            dVar29 = local_1f8.extrusionDir.y * local_1f8.extrusionDir.y +
                     (double)local_1f8.solid * (double)local_1f8.solid +
                     local_1f8.extrusionDir.x * local_1f8.extrusionDir.x;
            if (dVar29 < 0.0) {
              dVar29 = sqrt(dVar29);
            }
            else {
              dVar29 = SQRT(dVar29);
            }
            dVar29 = 1.0 / dVar29;
            local_1f8.solid = (IfcSolidModel *)((double)local_1f8.solid * dVar29);
            local_1f8.extrusionDir.x = local_1f8.extrusionDir.x * dVar29;
            local_1f8.extrusionDir.y = dVar29 * local_1f8.extrusionDir.y;
            if (local_188.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish !=
                local_188.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              (local_188.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->z = local_1f8.extrusionDir.y;
              (local_188.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = (double)local_1f8.solid;
              (local_188.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->y = local_1f8.extrusionDir.x;
              goto LAB_005b8455;
            }
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_realloc_insert<aiVector3t<double>const&>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_188,
                       (iterator)
                       local_188.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(aiVector3t<double> *)&local_1f8);
          }
          pTVar21 = pTVar21 + 1;
        } while (pTVar21 != pTVar4);
      }
    }
    local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((long)local_240.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_240.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      uVar17 = 0;
    }
    else {
      uVar17 = ((long)local_240.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_240.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      local_220 = local_220 * 0.1;
      lVar24 = 0;
      local_198 = 0;
      uVar23 = 0;
      do {
        uVar23 = uVar23 + 1;
        uVar20 = uVar23;
        if (uVar23 == uVar17) {
          uVar20 = 0;
        }
        local_1f8.solid = (IfcSolidModel *)CONCAT44(local_1f8.solid._4_4_,4);
        iVar7._M_current =
             (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (this_01,iVar7,(uint *)&local_1f8);
        }
        else {
          *iVar7._M_current = 4;
          ppuVar2 = &(this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar2 = *ppuVar2 + 1;
        }
        paVar19 = (aiVector3t<double> *)
                  ((long)&((IfcVector3 *)
                          &(local_240.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar24);
        iVar8._M_current =
             (pTVar22->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (pTVar22->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>const&>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)pTVar22,iVar8,
                     paVar19);
        }
        else {
          (iVar8._M_current)->z = paVar19->z;
          dVar29 = paVar19->y;
          (iVar8._M_current)->x = paVar19->x;
          (iVar8._M_current)->y = dVar29;
          ppaVar1 = &(pTVar22->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        paVar19 = local_240.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar20;
        iVar8._M_current =
             (pTVar22->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (pTVar22->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>const&>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)pTVar22,iVar8,
                     paVar19);
        }
        else {
          (iVar8._M_current)->z = paVar19->z;
          dVar29 = paVar19->y;
          (iVar8._M_current)->x = paVar19->x;
          (iVar8._M_current)->y = dVar29;
          ppaVar1 = &(pTVar22->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_1f8.solid =
             (IfcSolidModel *)
             (((IfcVector3 *)
              &local_240.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start[uVar20].x)->x + local_218.x);
        local_1f8.extrusionDir.x =
             local_240.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar20].y + local_218.y;
        local_1f8.extrusionDir.y =
             local_240.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar20].z + local_218.z;
        iVar8._M_current =
             (pTVar22->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (pTVar22->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)pTVar22,iVar8,
                     (aiVector3t<double> *)&local_1f8);
        }
        else {
          (iVar8._M_current)->z = local_1f8.extrusionDir.y;
          (iVar8._M_current)->x = (double)local_1f8.solid;
          (iVar8._M_current)->y = local_1f8.extrusionDir.x;
          ppaVar1 = &(pTVar22->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_1f8.solid =
             (IfcSolidModel *)
             (*(double *)
               ((long)&((IfcVector3 *)
                       &(local_240.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar24) + local_218.x);
        local_1f8.extrusionDir.x =
             *(double *)
              ((long)&(local_240.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->y + lVar24) + local_218.y;
        local_1f8.extrusionDir.y =
             *(double *)
              ((long)&(local_240.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->z + lVar24) + local_218.z;
        iVar8._M_current =
             (pTVar22->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (pTVar22->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)pTVar22,iVar8,
                     (aiVector3t<double> *)&local_1f8);
        }
        else {
          (iVar8._M_current)->z = local_1f8.extrusionDir.y;
          (iVar8._M_current)->x = (double)local_1f8.solid;
          (iVar8._M_current)->y = local_1f8.extrusionDir.x;
          ppaVar1 = &(pTVar22->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        if (bVar27 != false) {
          dVar28 = *(double *)
                    ((long)&((IfcVector3 *)
                            &(local_240.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar24) -
                   ((IfcVector3 *)
                   &local_240.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar20].x)->x;
          dVar30 = *(double *)
                    ((long)&(local_240.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->y + lVar24) -
                   local_240.
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar20].y;
          dVar29 = *(double *)
                    ((long)&(local_240.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->z + lVar24) -
                   local_240.
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar20].z;
          dVar29 = dVar29 * dVar29 + dVar28 * dVar28 + dVar30 * dVar30;
          if (dVar29 < 0.0) {
            dVar29 = sqrt(dVar29);
          }
          else {
            dVar29 = SQRT(dVar29);
          }
          if (local_220 < dVar29) {
            bVar11 = GenerateOpenings(local_228->apply_openings,&local_188,&local_148,true,true,
                                      &local_218);
            local_198 = local_198 + bVar11;
          }
          TempMesh::Append(local_190,&local_148);
          TempMesh::Clear(&local_148);
        }
        uVar17 = ((long)local_240.
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_240.
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        lVar24 = lVar24 + 0x18;
      } while (uVar23 < uVar17);
      uVar17 = CONCAT71((int7)(uVar20 * 3 >> 8),local_198 == 1);
    }
    if (bVar27 != false) {
      pTVar4 = (local_228->apply_openings->
               super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pTVar21 = (local_228->apply_openings->
                     super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                     )._M_impl.super__Vector_impl_data._M_start; pTVar21 != pTVar4;
          pTVar21 = pTVar21 + 1) {
        if ((pTVar21->wallPoints).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pTVar21->wallPoints).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5b87b5);
        }
        paVar15 = (pTVar21->wallPoints).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((pTVar21->wallPoints).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish != paVar15) {
          (pTVar21->wallPoints).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish = paVar15;
        }
      }
    }
    if ((char)local_110 == '\0') {
      bVar11 = false;
    }
    else {
      local_198 = CONCAT44(local_198._4_4_,(int)uVar17);
      local_220 = 0.0;
      lVar24 = 0;
      do {
        if (lVar24 == 1) {
          if (local_240.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_240.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar25 = 0x10;
            uVar17 = 0;
            do {
              local_1f8.solid =
                   (IfcSolidModel *)
                   (*(double *)
                     ((long)local_240.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar25 + -0x10) +
                   local_218.x);
              local_1f8.extrusionDir.x =
                   *(double *)
                    ((long)local_240.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar25 + -8) + local_218.y;
              local_1f8.extrusionDir.y =
                   *(double *)
                    ((long)&((IfcVector3 *)
                            &(local_240.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar25) +
                   local_218.z;
              iVar8._M_current =
                   (pTVar22->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar8._M_current ==
                  (pTVar22->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)pTVar22,
                           iVar8,(aiVector3t<double> *)&local_1f8);
              }
              else {
                (iVar8._M_current)->z = local_1f8.extrusionDir.y;
                (iVar8._M_current)->x = (double)local_1f8.solid;
                (iVar8._M_current)->y = local_1f8.extrusionDir.x;
                ppaVar1 = &(pTVar22->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + 1;
              }
              uVar17 = uVar17 + 1;
              lVar25 = lVar25 + 0x18;
            } while (uVar17 < (ulong)(((long)local_240.
                                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_240.
                                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x5555555555555555));
          }
        }
        else {
          lVar25 = (long)local_240.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_240.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (lVar25 != 0) {
            lVar26 = (lVar25 >> 3) * -0x5555555555555555;
            do {
              paVar19 = (aiVector3t<double> *)
                        ((long)&((IfcVector3 *)
                                &local_240.
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].x)->x + lVar25);
              iVar8._M_current =
                   (pTVar22->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar8._M_current ==
                  (pTVar22->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)pTVar22,
                           iVar8,paVar19);
              }
              else {
                (iVar8._M_current)->z = paVar19->z;
                dVar29 = paVar19->y;
                (iVar8._M_current)->x = paVar19->x;
                (iVar8._M_current)->y = dVar29;
                ppaVar1 = &(pTVar22->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + 1;
              }
              lVar26 = lVar26 + -1;
              lVar25 = lVar25 + -0x18;
            } while (lVar26 != 0);
          }
        }
        uVar13 = (int)((ulong)((long)local_240.
                                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_240.
                                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
        local_1f8.solid = (IfcSolidModel *)CONCAT44(local_1f8.solid._4_4_,uVar13);
        iVar7._M_current =
             (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (this_01,iVar7,(uint *)&local_1f8);
        }
        else {
          *iVar7._M_current = uVar13;
          ppuVar2 = &(this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar2 = *ppuVar2 + 1;
        }
        if ((bVar27 != false) &&
           (2 < (ulong)(((long)local_240.
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_240.
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       ))) {
          bVar11 = GenerateOpenings(local_228->apply_openings,&local_188,&local_148,true,true,
                                    &local_218);
          TempMesh::Append(local_190,&local_148);
          TempMesh::Clear(&local_148);
          local_220 = (double)((long)local_220 + (ulong)bVar11);
        }
        bVar11 = lVar24 == 0;
        lVar24 = lVar24 + 1;
      } while (bVar11);
      bVar11 = local_220 == 9.88131291682493e-324;
      uVar17 = local_198 & 0xffffffff;
    }
    pIVar10 = local_118;
    pTVar22 = local_190;
    if ((bVar27 & ((byte)uVar17 | bVar11)) == 1) {
      LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5b8a15);
    }
    LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x5b8a21);
    if (((char)local_16c != '\0') &&
       (((pTVar22->mVerts).
         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (pTVar22->mVerts).
         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish ||
        ((pTVar22->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
         .super__Vector_impl_data._M_start !=
         (pTVar22->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
         .super__Vector_impl_data._M_finish)))) {
      if (local_228->collect_openings ==
          (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0) {
        __assert_fail("conv.collect_openings",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCGeometry.cpp"
                      ,0x29b,
                      "void Assimp::IFC::ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid &, const TempMesh &, const IfcVector3 &, TempMesh &, ConversionData &, bool)"
                     );
      }
      local_158 = (TempMesh *)operator_new(0x30);
      (local_158->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_158->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_158->mVerts).
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_158->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_158->mVerts).
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_158->mVerts).
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::TempMesh*>
                (&local_150,local_158);
      TempMesh::Swap(local_158,pTVar22);
      local_168 = (TempMesh *)operator_new(0x30);
      (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_168->mVerts).
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_168->mVerts).
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_168->mVerts).
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::TempMesh*>
                (&local_160,local_168);
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)local_168,
                 (local_168->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 local_240.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_240.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      uVar13 = (int)((ulong)((long)local_240.
                                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_240.
                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
      local_1f8.solid = (IfcSolidModel *)CONCAT44(local_1f8.solid._4_4_,uVar13);
      iVar7._M_current =
           (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_168->mVertcnt,iVar7,(uint *)&local_1f8);
      }
      else {
        *iVar7._M_current = uVar13;
        ppuVar2 = &(local_168->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar2 = *ppuVar2 + 1;
      }
      this_00._M_pi = local_150._M_pi;
      this._M_pi = local_160._M_pi;
      pvVar3 = local_228->collect_openings;
      local_88 = local_218.x;
      dStack_80 = local_218.y;
      local_78 = local_218.z;
      if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
        }
      }
      if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
        }
      }
      local_1f8.extrusionDir.z = local_218.z;
      local_1f8.extrusionDir.x = local_218.x;
      local_1f8.extrusionDir.y = local_218.y;
      local_1f8.solid = (IfcSolidModel *)pIVar10;
      local_1f8.profileMesh.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_158;
      local_1f8.profileMesh.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_150._M_pi;
      if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
        }
      }
      local_1f8.profileMesh2D.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_168;
      local_1f8.profileMesh2D.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_160._M_pi;
      if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
        }
      }
      local_1f8.wallPoints.
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.wallPoints.
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8.wallPoints.
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
      emplace_back<Assimp::IFC::TempOpening>(pvVar3,&local_1f8);
      if (local_1f8.wallPoints.
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.wallPoints.
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1f8.profileMesh2D.
          super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1f8.profileMesh2D.
                   super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_1f8.profileMesh.
          super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1f8.profileMesh.
                   super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
      }
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
      if (((pTVar22->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (pTVar22->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish) ||
         ((pTVar22->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pTVar22->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        __assert_fail("result.IsEmpty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCGeometry.cpp"
                      ,0x2a4,
                      "void Assimp::IFC::ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid &, const TempMesh &, const IfcVector3 &, TempMesh &, ConversionData &, bool)"
                     );
      }
      if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
      }
      if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
      }
    }
    if (local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148.mVertcnt.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_148.mVerts.
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148.mVerts.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_188.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_240.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (IfcVector3 *)0x0) {
      operator_delete(local_240.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else if ((char)local_110 != '\0') {
    TempMesh::Append(result,curve);
    return;
  }
  return;
}

Assistant:

void ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid& solid, const TempMesh& curve,
    const IfcVector3& extrusionDir, TempMesh& result, ConversionData &conv, bool collect_openings)
{
    // Outline: 'curve' is now a list of vertex points forming the underlying profile, extrude along the given axis,
    // forming new triangles.
    const bool has_area = solid.SweptArea->ProfileType == "AREA" && curve.mVerts.size() > 2;
    if( solid.Depth < 1e-6 ) {
        if( has_area ) {
            result.Append(curve);
        }
        return;
    }

    result.mVerts.reserve(curve.mVerts.size()*(has_area ? 4 : 2));
    result.mVertcnt.reserve(curve.mVerts.size() + 2);
    std::vector<IfcVector3> in = curve.mVerts;

    // First step: transform all vertices into the target coordinate space
    IfcMatrix4 trafo;
    ConvertAxisPlacement(trafo, solid.Position);

    IfcVector3 vmin, vmax;
    MinMaxChooser<IfcVector3>()(vmin, vmax);
    for(IfcVector3& v : in) {
        v *= trafo;

        vmin = std::min(vmin, v);
        vmax = std::max(vmax, v);
    }

    vmax -= vmin;
    const IfcFloat diag = vmax.Length();
    IfcVector3 dir = IfcMatrix3(trafo) * extrusionDir;

    // reverse profile polygon if it's winded in the wrong direction in relation to the extrusion direction
    IfcVector3 profileNormal = TempMesh::ComputePolygonNormal(in.data(), in.size());
    if( profileNormal * dir < 0.0 )
        std::reverse(in.begin(), in.end());

    std::vector<IfcVector3> nors;
    const bool openings = !!conv.apply_openings && conv.apply_openings->size();

    // Compute the normal vectors for all opening polygons as a prerequisite
    // to TryAddOpenings_Poly2Tri()
    // XXX this belongs into the aforementioned function
    if( openings ) {

        if( !conv.settings.useCustomTriangulation ) {
            // it is essential to apply the openings in the correct spatial order. The direction
            // doesn't matter, but we would screw up if we started with e.g. a door in between
            // two windows.
            std::sort(conv.apply_openings->begin(), conv.apply_openings->end(), TempOpening::DistanceSorter(in[0]));
        }

        nors.reserve(conv.apply_openings->size());
        for(TempOpening& t : *conv.apply_openings) {
            TempMesh& bounds = *t.profileMesh.get();

            if( bounds.mVerts.size() <= 2 ) {
                nors.push_back(IfcVector3());
                continue;
            }
            nors.push_back(((bounds.mVerts[2] - bounds.mVerts[0]) ^ (bounds.mVerts[1] - bounds.mVerts[0])).Normalize());
        }
    }


    TempMesh temp;
    TempMesh& curmesh = openings ? temp : result;
    std::vector<IfcVector3>& out = curmesh.mVerts;

    size_t sides_with_openings = 0;
    for( size_t i = 0; i < in.size(); ++i ) {
        const size_t next = (i + 1) % in.size();

        curmesh.mVertcnt.push_back(4);

        out.push_back(in[i]);
        out.push_back(in[next]);
        out.push_back(in[next] + dir);
        out.push_back(in[i] + dir);

        if( openings ) {
            if( (in[i] - in[next]).Length() > diag * 0.1 && GenerateOpenings(*conv.apply_openings, nors, temp, true, true, dir) ) {
                ++sides_with_openings;
            }

            result.Append(temp);
            temp.Clear();
        }
    }

    if( openings ) {
        for(TempOpening& opening : *conv.apply_openings) {
            if( !opening.wallPoints.empty() ) {
                IFCImporter::LogError("failed to generate all window caps");
            }
            opening.wallPoints.clear();
        }
    }

    size_t sides_with_v_openings = 0;
    if( has_area ) {

        for( size_t n = 0; n < 2; ++n ) {
            if( n > 0 ) {
                for( size_t i = 0; i < in.size(); ++i )
                    out.push_back(in[i] + dir);
            }
            else {
                for( size_t i = in.size(); i--; )
                    out.push_back(in[i]);
            }

            curmesh.mVertcnt.push_back(static_cast<unsigned int>(in.size()));
            if( openings && in.size() > 2 ) {
                if( GenerateOpenings(*conv.apply_openings, nors, temp, true, true, dir) ) {
                    ++sides_with_v_openings;
                }

                result.Append(temp);
                temp.Clear();
            }
        }
    }

    if( openings && ((sides_with_openings == 1 && sides_with_openings) || (sides_with_v_openings == 2 && sides_with_v_openings)) ) {
        IFCImporter::LogWarn("failed to resolve all openings, presumably their topology is not supported by Assimp");
    }

    IFCImporter::LogDebug("generate mesh procedurally by extrusion (IfcExtrudedAreaSolid)");

    // If this is an opening element, store both the extruded mesh and the 2D profile mesh
    // it was created from. Return an empty mesh to the caller.
    if( collect_openings && !result.IsEmpty() ) {
        ai_assert(conv.collect_openings);
        std::shared_ptr<TempMesh> profile = std::shared_ptr<TempMesh>(new TempMesh());
        profile->Swap(result);

        std::shared_ptr<TempMesh> profile2D = std::shared_ptr<TempMesh>(new TempMesh());
        profile2D->mVerts.insert(profile2D->mVerts.end(), in.begin(), in.end());
        profile2D->mVertcnt.push_back(static_cast<unsigned int>(in.size()));
        conv.collect_openings->push_back(TempOpening(&solid, dir, profile, profile2D));

        ai_assert(result.IsEmpty());
    }
}